

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.c
# Opt level: O2

Expr * primary_expr(void)

{
  byte bVar1;
  uint uVar2;
  char cVar3;
  int iVar4;
  Expr *pEVar5;
  ushort **ppuVar6;
  char *name;
  Symbol *pSVar7;
  __int32_t **pp_Var8;
  byte *pbVar9;
  byte *pbVar10;
  int errn;
  ulong uVar11;
  long lVar12;
  _func_int_GlobalVars_ptr_lword_lword_ptr **pp_Var13;
  lword val;
  
  pbVar10 = (byte *)s;
  val = 0;
  bVar1 = *s;
  uVar11 = (ulong)bVar1;
  if (uVar11 == 0x28) {
    s = s + 1;
    skip();
    pEVar5 = expression();
    if (*s == ')') {
      s = s + 1;
    }
    else {
      error(0x42,scriptname,(ulong)(uint)line,0x29);
    }
    skip();
    return pEVar5;
  }
  ppuVar6 = __ctype_b_loc();
  if ((*(byte *)((long)*ppuVar6 + uVar11 * 2 + 1) & 8) == 0) {
    name = getarg('\x01');
    if (name == (char *)0x0) {
      iVar4 = 0x4e;
LAB_001148ed:
      error(iVar4,scriptname,(ulong)(uint)line);
LAB_001148f5:
      iVar4 = 0x15;
      goto LAB_0011499f;
    }
    if ((*name == '.') && (name[1] == '\0')) {
      iVar4 = 0x15;
      if (caddr == -2) goto LAB_0011499f;
      lVar12 = caddr;
      if (caddr == -1) {
        error(0x65,scriptname,(ulong)(uint)line);
        goto LAB_0011499f;
      }
LAB_00114a83:
      iVar4 = 0x16;
      val = lVar12;
      goto LAB_0011499f;
    }
    pSVar7 = findsymbol(gv,(Section *)0x0,name);
    if (pSVar7 == (Symbol *)0x0) {
      for (pp_Var13 = &ldFunctions[0].funcptr; ((ScriptFunc *)(pp_Var13 + -1))->name != (char *)0x0;
          pp_Var13 = pp_Var13 + 2) {
        iVar4 = strcmp(((ScriptFunc *)(pp_Var13 + -1))->name,name);
        if (iVar4 == 0) {
          if (caddr == -1) {
            iVar4 = 0x69;
            goto LAB_001148ed;
          }
          if (caddr != -2) {
            iVar4 = (**pp_Var13)(gv,caddr,&val);
            iVar4 = (iVar4 == 0) + 0x15;
            goto LAB_0011499f;
          }
          cVar3 = getchr();
          if (cVar3 == '(') {
            skipblock(1,'(',')');
          }
          else {
            s = s + -1;
          }
          goto LAB_001148f5;
        }
      }
      iVar4 = 0x15;
      if (caddr == -2) goto LAB_0011499f;
      errn = 0x68;
    }
    else {
      iVar4 = 0x15;
      if (caddr == -2) goto LAB_0011499f;
      if (caddr == -1) {
        if (pSVar7->type == '\x01') {
LAB_00114a0c:
          val = pSVar7->value;
          goto LAB_0011499f;
        }
        name = pSVar7->name;
        errn = 0x66;
      }
      else {
        if (pSVar7->type == '\x02') {
          if (pSVar7->relsect->lnksec != (LinkedSection *)0x0) {
            lVar12 = pSVar7->value + pSVar7->relsect->va;
            goto LAB_00114a83;
          }
        }
        else if (pSVar7->type == '\x01') goto LAB_00114a0c;
        name = pSVar7->name;
        errn = 0x6a;
      }
    }
    iVar4 = 0x15;
    error(errn,scriptname,(ulong)(uint)line,name);
    goto LAB_0011499f;
  }
  if (bVar1 == 0x30) {
    if ((byte)(((char *)pbVar10)[1] | 0x20U) != 0x78) {
      uVar2 = 8;
      goto LAB_0011492d;
    }
    s = (char *)pbVar10 + 2;
    lVar12 = 0;
    while( true ) {
      bVar1 = *s;
      uVar11 = (ulong)bVar1;
      pbVar10 = (byte *)s;
      if ((*(byte *)((long)*ppuVar6 + uVar11 * 2 + 1) & 0x10) == 0) break;
      if ((byte)(bVar1 - 0x30) < 10) {
        s = s + 1;
        lVar12 = lVar12 * 0x10 + uVar11 + -0x30;
        val = lVar12;
      }
      else {
        s = s + 1;
        if ((byte)(bVar1 + 0x9f) < 6) {
          lVar12 = lVar12 * 0x10 + uVar11 + -0x57;
          val = lVar12;
        }
        else {
          lVar12 = lVar12 * 0x10 + (long)(char)bVar1 + -0x37;
          val = lVar12;
        }
      }
    }
  }
  else {
    uVar2 = 10;
LAB_0011492d:
    lVar12 = 0;
    while( true ) {
      pbVar9 = pbVar10 + 1;
      if (((char)uVar11 < '0') || ((int)(uVar2 | 0x30) <= (int)(char)uVar11)) break;
      lVar12 = lVar12 * (ulong)uVar2 + uVar11 + -0x30;
      uVar11 = (ulong)*pbVar9;
      pbVar10 = pbVar9;
      s = (char *)pbVar9;
      val = lVar12;
    }
  }
  pp_Var8 = __ctype_toupper_loc();
  iVar4 = 0x15;
  if ((*pp_Var8)[uVar11] == 0x4d) {
    val = lVar12 << 0x14;
  }
  else {
    if ((*pp_Var8)[uVar11] != 0x4b) goto LAB_0011499f;
    val = lVar12 << 10;
  }
  s = (char *)(pbVar10 + 1);
LAB_0011499f:
  skip();
  pEVar5 = new_expr();
  pEVar5->type = iVar4;
  pEVar5->val = val;
  return pEVar5;
}

Assistant:

static struct Expr *primary_expr(void)
{
  lword val = 0;
  int type = ABS;
  struct Expr *new;

  if (*s == '(') {
    s++;
    skip();
    new = expression();
    if (*s != ')')
      error(66,scriptname,line,')');  /* ')' expected */
    else
      s++;
    skip();
    return new;
  }

  if (isdigit((unsigned char)*s)) {
    /* octal, decimal or hex constant */
    if (s[0]=='0' && (s[1]=='x' || s[1]=='X')) {
      s += 2;
      while (isxdigit((unsigned char)*s)) {
        if (*s>='0' && *s<='9')
          val = (val<<4) + *s++ - '0';
        else if (*s>='a' && *s<='f')
          val = (val<<4) + *s++ - 'a' + 10;
        else
          val = (val<<4) + *s++ - 'A' + 10;
      }
    }
    else {
      int base = (*s=='0') ? 8 : 10;

      while (*s>='0' && *s<('0'+base)) {
        val = base*val + *s++ - '0';
      }
    }

    if (toupper((unsigned char)*s) == 'K') {
      val <<= 10;
      s++;
    }
    else if (toupper((unsigned char)*s) == 'M') {
      val <<= 20;
      s++;
    }
  }

  else {
    char *word;

    if (word = getarg(1)) {
      if (word[0]=='.' && word[1]=='\0') {  /* current address symbol '.' */
        if (caddr != -1) {
          if (caddr != -2) {
            val = caddr;
            type = REL;
          }
        }
        else {
          /* Address symbol '.' invalid outside SECTIONS block */
          error(101,scriptname,line);
        }
      }
      else {  /* otherwise it's possibly a function- or symbol-name */
        struct Symbol *sym;

        if (sym = findsymbol(gv,NULL,word)) {
          if (caddr==-1 && sym->type!=SYM_ABS) {
            /* Reference to non-absolute symbol */
            error(102,scriptname,line,sym->name);
          }
          else if (caddr != -2) {
            if (sym->type == SYM_ABS) {
              val = sym->value;
            }
            else if (sym->type==SYM_RELOC && sym->relsect->lnksec!=NULL) {
              val = (lword)sym->relsect->va + sym->value;
              type = REL;
            }
            else {
              /* Symbol is not yet assigned */
              error(106,scriptname,line,sym->name);
            }
          }
        }
        else {
          struct ScriptFunc *sfptr;

          for (sfptr=ldFunctions; sfptr->name; sfptr++) {
            if (!strcmp(sfptr->name,word))
              break;
          }
          if (sfptr->name) {
            if (caddr == -2) {
              if (getchr() == '(')
                skipblock(1,'(',')');
              else
                back(1);
            }
            else if (caddr != -1)
              type = sfptr->funcptr(gv,caddr,&val) ? ABS : REL;
            else
              error(105,scriptname,line);  /* No function-calls allowed here */
          }
          else if (caddr != -2)
            error(104,scriptname,line,word);  /* Unknown symbol or function */
        }
      }
    }
    else
      error(78,scriptname,line);   /* missing argument */
  }

  skip();
  new = new_expr();
  new->type = type;
  new->val = val;
  return new;
}